

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O1

void embree::avx::SphereMiIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Geometry *pGVar4;
  __int_type_conflict _Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  RayHitK<4> *pRVar14;
  long lVar16;
  Scene *pSVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 extraout_var [56];
  float fVar27;
  float fVar32;
  float fVar33;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar34;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  HitK<4> h;
  undefined1 local_278 [16];
  RayQueryContext *local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined4 local_23c;
  undefined8 *local_238;
  void *local_230;
  RTCRayQueryContext *local_228;
  RayHitK<4> *local_220;
  undefined1 (*local_218) [16];
  undefined4 local_210;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  Scene *local_190;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined1 local_58 [32];
  ulong uVar15;
  undefined1 auVar47 [64];
  undefined1 auVar49 [64];
  
  pSVar17 = context->scene;
  pGVar4 = (pSVar17->geometries).items[sphere->sharedGeomID].ptr;
  lVar16 = *(long *)&pGVar4->field_0x58;
  _Var5 = pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar28 = *(undefined1 (*) [16])(lVar16 + (sphere->primIDs).field_0.i[0] * _Var5);
  auVar24 = *(undefined1 (*) [16])(lVar16 + (sphere->primIDs).field_0.i[1] * _Var5);
  auVar50 = *(undefined1 (*) [16])(lVar16 + (sphere->primIDs).field_0.i[2] * _Var5);
  auVar46 = *(undefined1 (*) [16])(lVar16 + (sphere->primIDs).field_0.i[3] * _Var5);
  auVar35 = vunpcklps_avx(auVar28,auVar50);
  auVar28 = vunpckhps_avx(auVar28,auVar50);
  auVar50 = vunpcklps_avx(auVar24,auVar46);
  auVar24 = vunpckhps_avx(auVar24,auVar46);
  auVar46 = vunpcklps_avx(auVar35,auVar50);
  auVar50 = vunpckhps_avx(auVar35,auVar50);
  auVar23 = vunpcklps_avx(auVar28,auVar24);
  auVar37 = vunpckhps_avx(auVar28,auVar24);
  auVar28 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar24 = vpcmpgtd_avx(auVar28,_DAT_01ff0cf0);
  local_f8 = vpshufd_avx(ZEXT416(sphere->sharedGeomID),0);
  uVar13 = *(undefined4 *)(ray + k * 4);
  auVar45._4_4_ = uVar13;
  auVar45._0_4_ = uVar13;
  auVar45._8_4_ = uVar13;
  auVar45._12_4_ = uVar13;
  auVar46 = vsubps_avx(auVar46,auVar45);
  uVar13 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar35._4_4_ = uVar13;
  auVar35._0_4_ = uVar13;
  auVar35._8_4_ = uVar13;
  auVar35._12_4_ = uVar13;
  auVar35 = vsubps_avx(auVar50,auVar35);
  uVar13 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar28._4_4_ = uVar13;
  auVar28._0_4_ = uVar13;
  auVar28._8_4_ = uVar13;
  auVar28._12_4_ = uVar13;
  auVar23 = vsubps_avx(auVar23,auVar28);
  fVar1 = *(float *)(ray + k * 4 + 0x40);
  auVar57 = ZEXT1664(CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))));
  fVar2 = *(float *)(ray + k * 4 + 0x50);
  auVar58 = ZEXT1664(CONCAT412(fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))));
  fVar3 = *(float *)(ray + k * 4 + 0x60);
  auVar59 = ZEXT1664(CONCAT412(fVar3,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))));
  auVar28 = ZEXT416((uint)(fVar1 * fVar1 + fVar2 * fVar2 + fVar3 * fVar3));
  auVar50 = vshufps_avx(auVar28,auVar28,0);
  auVar28 = vrcpps_avx(auVar50);
  fVar27 = auVar28._0_4_;
  auVar29._0_4_ = fVar27 * auVar50._0_4_;
  fVar32 = auVar28._4_4_;
  auVar29._4_4_ = fVar32 * auVar50._4_4_;
  fVar33 = auVar28._8_4_;
  auVar29._8_4_ = fVar33 * auVar50._8_4_;
  fVar34 = auVar28._12_4_;
  auVar29._12_4_ = fVar34 * auVar50._12_4_;
  auVar50._8_4_ = 0x3f800000;
  auVar50._0_8_ = &DAT_3f8000003f800000;
  auVar50._12_4_ = 0x3f800000;
  auVar28 = vsubps_avx(auVar50,auVar29);
  fVar27 = fVar27 + fVar27 * auVar28._0_4_;
  fVar32 = fVar32 + fVar32 * auVar28._4_4_;
  fVar33 = fVar33 + fVar33 * auVar28._8_4_;
  fVar34 = fVar34 + fVar34 * auVar28._12_4_;
  auVar36._0_4_ = (fVar1 * auVar46._0_4_ + fVar2 * auVar35._0_4_ + fVar3 * auVar23._0_4_) * fVar27;
  auVar36._4_4_ = (fVar1 * auVar46._4_4_ + fVar2 * auVar35._4_4_ + fVar3 * auVar23._4_4_) * fVar32;
  auVar36._8_4_ = (fVar1 * auVar46._8_4_ + fVar2 * auVar35._8_4_ + fVar3 * auVar23._8_4_) * fVar33;
  auVar36._12_4_ =
       (fVar1 * auVar46._12_4_ + fVar2 * auVar35._12_4_ + fVar3 * auVar23._12_4_) * fVar34;
  auVar51._0_4_ = fVar1 * auVar36._0_4_;
  auVar51._4_4_ = fVar1 * auVar36._4_4_;
  auVar51._8_4_ = fVar1 * auVar36._8_4_;
  auVar51._12_4_ = fVar1 * auVar36._12_4_;
  auVar53._0_4_ = fVar2 * auVar36._0_4_;
  auVar53._4_4_ = fVar2 * auVar36._4_4_;
  auVar53._8_4_ = fVar2 * auVar36._8_4_;
  auVar53._12_4_ = fVar2 * auVar36._12_4_;
  auVar55._0_4_ = fVar3 * auVar36._0_4_;
  auVar55._4_4_ = fVar3 * auVar36._4_4_;
  auVar55._8_4_ = fVar3 * auVar36._8_4_;
  auVar55._12_4_ = fVar3 * auVar36._12_4_;
  auVar50 = vsubps_avx(auVar46,auVar51);
  auVar60 = ZEXT1664(auVar50);
  auVar46 = vsubps_avx(auVar35,auVar53);
  auVar54 = ZEXT1664(auVar46);
  auVar35 = vsubps_avx(auVar23,auVar55);
  auVar56 = ZEXT1664(auVar35);
  auVar42._0_4_ =
       auVar50._0_4_ * auVar50._0_4_ + auVar46._0_4_ * auVar46._0_4_ + auVar35._0_4_ * auVar35._0_4_
  ;
  auVar42._4_4_ =
       auVar50._4_4_ * auVar50._4_4_ + auVar46._4_4_ * auVar46._4_4_ + auVar35._4_4_ * auVar35._4_4_
  ;
  auVar42._8_4_ =
       auVar50._8_4_ * auVar50._8_4_ + auVar46._8_4_ * auVar46._8_4_ + auVar35._8_4_ * auVar35._8_4_
  ;
  auVar42._12_4_ =
       auVar50._12_4_ * auVar50._12_4_ +
       auVar46._12_4_ * auVar46._12_4_ + auVar35._12_4_ * auVar35._12_4_;
  auVar22._0_4_ = auVar37._0_4_ * auVar37._0_4_;
  auVar22._4_4_ = auVar37._4_4_ * auVar37._4_4_;
  auVar22._8_4_ = auVar37._8_4_ * auVar37._8_4_;
  auVar22._12_4_ = auVar37._12_4_ * auVar37._12_4_;
  auVar28 = vcmpps_avx(auVar42,auVar22,2);
  auVar23 = auVar24 & auVar28;
  if ((((auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar23 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar23[0xf] < '\0') {
    auVar28 = vandps_avx(auVar28,auVar24);
    auVar24 = vsubps_avx(auVar22,auVar42);
    auVar23._0_4_ = fVar27 * auVar24._0_4_;
    auVar23._4_4_ = fVar32 * auVar24._4_4_;
    auVar23._8_4_ = fVar33 * auVar24._8_4_;
    auVar23._12_4_ = fVar34 * auVar24._12_4_;
    auVar22 = vsqrtps_avx(auVar23);
    auVar61 = ZEXT1664(auVar22);
    auVar29 = vsubps_avx(auVar36,auVar22);
    auVar48._0_4_ = auVar22._0_4_ + auVar36._0_4_;
    auVar48._4_4_ = auVar22._4_4_ + auVar36._4_4_;
    auVar48._8_4_ = auVar22._8_4_ + auVar36._8_4_;
    auVar48._12_4_ = auVar22._12_4_ + auVar36._12_4_;
    auVar49 = ZEXT1664(auVar48);
    uVar13 = *(undefined4 *)(ray + k * 4 + 0x30);
    auVar37._4_4_ = uVar13;
    auVar37._0_4_ = uVar13;
    auVar37._8_4_ = uVar13;
    auVar37._12_4_ = uVar13;
    auVar24 = vcmpps_avx(auVar37,auVar29,2);
    uVar13 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar43._4_4_ = uVar13;
    auVar43._0_4_ = uVar13;
    auVar43._8_4_ = uVar13;
    auVar43._12_4_ = uVar13;
    auVar23 = vcmpps_avx(auVar29,auVar43,2);
    auVar24 = vandps_avx(auVar23,auVar24);
    auVar62 = ZEXT1664(auVar24);
    auVar24 = vandps_avx(auVar24,auVar28);
    auVar23 = vcmpps_avx(auVar37,auVar48,2);
    auVar37 = vcmpps_avx(auVar48,auVar43,2);
    auVar23 = vandps_avx(auVar23,auVar37);
    auVar28 = vandps_avx(auVar23,auVar28);
    auVar44 = ZEXT1664(auVar28);
    local_278 = vorps_avx(auVar24,auVar28);
    if ((((local_278 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (local_278 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (local_278 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        local_278[0xf] < '\0') {
      auVar38._0_8_ = auVar22._0_8_ ^ 0x8000000080000000;
      auVar38._8_4_ = -auVar22._8_4_;
      auVar38._12_4_ = -auVar22._12_4_;
      local_1e8 = vblendvps_avx(auVar48,auVar29,auVar24);
      auVar28 = vblendvps_avx(auVar22,auVar38,auVar24);
      fVar27 = auVar28._0_4_;
      auVar30._0_4_ = fVar1 * fVar27;
      fVar32 = auVar28._4_4_;
      auVar30._4_4_ = fVar1 * fVar32;
      fVar33 = auVar28._8_4_;
      auVar30._8_4_ = fVar1 * fVar33;
      fVar34 = auVar28._12_4_;
      auVar30._12_4_ = fVar1 * fVar34;
      auVar39._0_4_ = fVar2 * fVar27;
      auVar39._4_4_ = fVar2 * fVar32;
      auVar39._8_4_ = fVar2 * fVar33;
      auVar39._12_4_ = fVar2 * fVar34;
      auVar24._0_4_ = fVar3 * fVar27;
      auVar24._4_4_ = fVar3 * fVar32;
      auVar24._8_4_ = fVar3 * fVar33;
      auVar24._12_4_ = fVar3 * fVar34;
      local_1c8 = vsubps_avx(auVar30,auVar50);
      local_1b8 = vsubps_avx(auVar39,auVar46);
      local_1a8 = vsubps_avx(auVar24,auVar35);
      local_1d8 = local_1e8;
      auVar46._8_4_ = 0x7f800000;
      auVar46._0_8_ = 0x7f8000007f800000;
      auVar46._12_4_ = 0x7f800000;
      auVar47 = ZEXT1664(auVar46);
      auVar28 = vblendvps_avx(auVar46,local_1e8,local_278);
      auVar24 = vshufps_avx(auVar28,auVar28,0xb1);
      auVar24 = vminps_avx(auVar24,auVar28);
      auVar50 = vshufpd_avx(auVar24,auVar24,1);
      auVar24 = vminps_avx(auVar50,auVar24);
      auVar28 = vcmpps_avx(auVar28,auVar24,0);
      auVar50 = local_278 & auVar28;
      auVar24 = vpcmpeqd_avx(auVar24,auVar24);
      if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar50[0xf] < '\0'
         ) {
        auVar24 = auVar28;
      }
      auVar28 = vandps_avx(local_278,auVar24);
      uVar11 = vmovmskps_avx(auVar28);
      lVar16 = 0;
      if (uVar11 != 0) {
        for (; (uVar11 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
        }
      }
      lVar18 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
      local_58 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar52 = ZEXT1664(CONCAT88(0x100000001,0x100000001));
      do {
        auVar28 = auVar44._0_16_;
        auVar24 = auVar54._0_16_;
        auVar46 = auVar57._0_16_;
        local_218 = &local_e8;
        local_238 = &local_258;
        auVar50 = auVar56._0_16_;
        auVar37 = auVar60._0_16_;
        auVar23 = auVar59._0_16_;
        auVar35 = auVar58._0_16_;
        auVar22 = auVar61._0_16_;
        auVar29 = auVar62._0_16_;
        uVar11 = *(uint *)(local_f8 + lVar16 * 4);
        pRVar14 = (RayHitK<4> *)(ulong)uVar11;
        pGVar4 = (pSVar17->geometries).items[(long)pRVar14].ptr;
        local_220 = ray;
        if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          *(undefined4 *)(local_278 + lVar16 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1d8 + lVar16 * 4);
            *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1c8 + lVar16 * 4);
            *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1b8 + lVar16 * 4);
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1a8 + lVar16 * 4);
            *(undefined4 *)(ray + k * 4 + 0xf0) = 0;
            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
            *(uint *)(ray + k * 4 + 0x110) = (sphere->primIDs).field_0.i[lVar16];
            *(uint *)(ray + k * 4 + 0x120) = uVar11;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            uVar13 = 0;
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
LAB_00ea06ef:
            uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar20._4_4_ = uVar12;
            auVar20._0_4_ = uVar12;
            auVar20._8_4_ = uVar12;
            auVar20._12_4_ = uVar12;
            local_1d8 = auVar49._0_16_;
            auVar36 = vcmpps_avx(local_1d8,auVar20,2);
            auVar29 = vandps_avx(auVar29,auVar36);
            auVar36 = auVar28 & auVar29;
            if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar36 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar36 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar36[0xf]) {
              return;
            }
            local_278 = vandps_avx(auVar29,auVar28);
            fVar1 = auVar22._0_4_;
            auVar26._0_4_ = auVar46._0_4_ * fVar1;
            fVar2 = auVar22._4_4_;
            auVar26._4_4_ = auVar46._4_4_ * fVar2;
            fVar3 = auVar22._8_4_;
            auVar26._8_4_ = auVar46._8_4_ * fVar3;
            fVar27 = auVar22._12_4_;
            auVar26._12_4_ = auVar46._12_4_ * fVar27;
            auVar31._0_4_ = auVar35._0_4_ * fVar1;
            auVar31._4_4_ = auVar35._4_4_ * fVar2;
            auVar31._8_4_ = auVar35._8_4_ * fVar3;
            auVar31._12_4_ = auVar35._12_4_ * fVar27;
            auVar41._0_4_ = auVar23._0_4_ * fVar1;
            auVar41._4_4_ = auVar23._4_4_ * fVar2;
            auVar41._8_4_ = auVar23._8_4_ * fVar3;
            auVar41._12_4_ = auVar23._12_4_ * fVar27;
            local_1c8 = vsubps_avx(auVar26,auVar37);
            local_1b8 = vsubps_avx(auVar31,auVar24);
            local_1a8 = vsubps_avx(auVar41,auVar50);
            pSVar17 = context->scene;
            auVar28 = vblendvps_avx(auVar47._0_16_,local_1d8,local_278);
            auVar24 = vshufps_avx(auVar28,auVar28,0xb1);
            auVar24 = vminps_avx(auVar24,auVar28);
            auVar50 = vshufpd_avx(auVar24,auVar24,1);
            auVar24 = vminps_avx(auVar50,auVar24);
            auVar24 = vcmpps_avx(auVar28,auVar24,0);
            auVar50 = local_278 & auVar24;
            auVar28 = local_278;
            if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar50[0xf] < '\0') {
              auVar28 = vandps_avx(auVar24,local_278);
            }
            uVar12 = vmovmskps_avx(auVar28);
            lVar16 = 0;
            if (CONCAT44(uVar13,uVar12) != 0) {
              for (; (CONCAT44(uVar13,uVar12) >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
              }
            }
            lVar18 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
            auVar28 = ZEXT816(0) << 0x40;
            auVar54 = ZEXT1664(auVar28);
            auVar6 = vcmpps_avx(ZEXT1632(auVar28),ZEXT1632(auVar28),0xf);
            auVar56 = ZEXT3264(auVar6);
            auVar57 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar28 = vpcmpeqd_avx(auVar35,auVar35);
            auVar58 = ZEXT1664(auVar28);
            do {
              local_218 = &local_e8;
              local_238 = &local_258;
              local_1f8 = auVar52._0_16_;
              uVar11 = *(uint *)(local_f8 + lVar16 * 4);
              pRVar14 = (RayHitK<4> *)(ulong)uVar11;
              pGVar4 = (pSVar17->geometries).items[(long)pRVar14].ptr;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_278 + lVar16 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1d8 + lVar16 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1c8 + lVar16 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1b8 + lVar16 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1a8 + lVar16 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(uint *)(ray + k * 4 + 0x110) = (sphere->primIDs).field_0.i[lVar16];
                  *(uint *)(ray + k * 4 + 0x120) = uVar11;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  return;
                }
                local_88 = vpshufd_avx(ZEXT416(uVar11),0);
                local_98._4_4_ = (sphere->primIDs).field_0.i[lVar16];
                local_e8._0_4_ = *(undefined4 *)(local_1c8 + lVar16 * 4);
                local_d8._4_4_ = *(undefined4 *)(local_1b8 + lVar16 * 4);
                uVar13 = *(undefined4 *)(local_1a8 + lVar16 * 4);
                local_c8._4_4_ = uVar13;
                local_c8._0_4_ = uVar13;
                local_c8._8_4_ = uVar13;
                local_c8._12_4_ = uVar13;
                local_e8._4_4_ = local_e8._0_4_;
                local_e8._8_4_ = local_e8._0_4_;
                local_e8._12_4_ = local_e8._0_4_;
                local_d8._0_4_ = local_d8._4_4_;
                local_d8._8_4_ = local_d8._4_4_;
                local_d8._12_4_ = local_d8._4_4_;
                local_b8 = auVar54._0_32_;
                local_98._0_4_ = local_98._4_4_;
                local_98._8_4_ = local_98._4_4_;
                local_98._12_4_ = local_98._4_4_;
                uStack_74 = context->user->instID[0];
                local_78 = uStack_74;
                uStack_70 = uStack_74;
                uStack_6c = uStack_74;
                uStack_68 = context->user->instPrimID[0];
                uStack_64 = uStack_68;
                uStack_60 = uStack_68;
                uStack_5c = uStack_68;
                local_188._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1d8 + lVar16 * 4);
                local_258 = *(undefined8 *)(mm_lookupmask_ps + lVar18);
                uStack_250 = *(undefined8 *)(mm_lookupmask_ps + lVar18 + 8);
                local_230 = pGVar4->userPtr;
                local_228 = context->user;
                local_210 = 4;
                pRVar14 = (RayHitK<4> *)pGVar4->intersectionFilterN;
                local_208 = auVar49._0_16_;
                local_1e8._0_8_ = pSVar17;
                local_58 = auVar56._0_32_;
                local_260 = context;
                local_220 = ray;
                if (pRVar14 != (RayHitK<4> *)0x0) {
                  auVar28 = auVar58._0_16_;
                  pRVar14 = (RayHitK<4> *)(*(code *)pRVar14)(&local_238);
                  auVar28 = vpcmpeqd_avx(auVar28,auVar28);
                  auVar58 = ZEXT1664(auVar28);
                  auVar57 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar56 = ZEXT3264(local_58);
                  auVar54 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar47 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                  auVar49 = ZEXT1664(local_208);
                  pSVar17 = (Scene *)local_1e8._0_8_;
                }
                auVar9._8_8_ = uStack_250;
                auVar9._0_8_ = local_258;
                auVar28 = auVar58._0_16_;
                if (auVar9 == (undefined1  [16])0x0) {
                  auVar24 = vpcmpeqd_avx(auVar57._0_16_,(undefined1  [16])0x0);
                  auVar28 = auVar28 ^ auVar24;
                  auVar52 = ZEXT1664(local_1f8);
                  context = local_260;
                }
                else {
                  pRVar14 = (RayHitK<4> *)local_260->args->filter;
                  if ((pRVar14 != (RayHitK<4> *)0x0) &&
                     (((local_260->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    pRVar14 = (RayHitK<4> *)(*(code *)pRVar14)(&local_238);
                    auVar28 = vpcmpeqd_avx(auVar28,auVar28);
                    auVar58 = ZEXT1664(auVar28);
                    auVar57 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar56 = ZEXT3264(local_58);
                    auVar54 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar47 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000))
                                      );
                    auVar49 = ZEXT1664(local_208);
                    pSVar17 = (Scene *)local_1e8._0_8_;
                  }
                  auVar10._8_8_ = uStack_250;
                  auVar10._0_8_ = local_258;
                  auVar24 = vpcmpeqd_avx(auVar57._0_16_,auVar10);
                  auVar28 = auVar58._0_16_ ^ auVar24;
                  auVar52 = ZEXT1664(local_1f8);
                  context = local_260;
                  if (auVar10 != (undefined1  [16])0x0) {
                    auVar24 = auVar58._0_16_ ^ auVar24;
                    auVar50 = vmaskmovps_avx(auVar24,*local_218);
                    *(undefined1 (*) [16])(local_220 + 0xc0) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar24,local_218[1]);
                    *(undefined1 (*) [16])(local_220 + 0xd0) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar24,local_218[2]);
                    *(undefined1 (*) [16])(local_220 + 0xe0) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar24,local_218[3]);
                    *(undefined1 (*) [16])(local_220 + 0xf0) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar24,local_218[4]);
                    *(undefined1 (*) [16])(local_220 + 0x100) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar24,local_218[5]);
                    *(undefined1 (*) [16])(local_220 + 0x110) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar24,local_218[6]);
                    *(undefined1 (*) [16])(local_220 + 0x120) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar24,local_218[7]);
                    *(undefined1 (*) [16])(local_220 + 0x130) = auVar50;
                    auVar24 = vmaskmovps_avx(auVar24,local_218[8]);
                    *(undefined1 (*) [16])(local_220 + 0x140) = auVar24;
                    pRVar14 = local_220;
                  }
                }
                if ((auVar52._0_16_ & auVar28) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_188._0_4_;
                }
                *(undefined4 *)(local_278 + lVar16 * 4) = 0;
                uVar13 = *(undefined4 *)(ray + k * 4 + 0x80);
                auVar21._4_4_ = uVar13;
                auVar21._0_4_ = uVar13;
                auVar21._8_4_ = uVar13;
                auVar21._12_4_ = uVar13;
                auVar28 = vcmpps_avx(auVar49._0_16_,auVar21,2);
                local_278 = vandps_avx(auVar28,local_278);
              }
              if ((((local_278 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_278 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_278 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_278[0xf]) {
                return;
              }
              auVar28 = vblendvps_avx(auVar47._0_16_,auVar49._0_16_,local_278);
              auVar24 = vshufps_avx(auVar28,auVar28,0xb1);
              auVar24 = vminps_avx(auVar24,auVar28);
              auVar50 = vshufpd_avx(auVar24,auVar24,1);
              auVar24 = vminps_avx(auVar50,auVar24);
              auVar24 = vcmpps_avx(auVar28,auVar24,0);
              auVar50 = local_278 & auVar24;
              auVar28 = local_278;
              if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar50[0xf] < '\0') {
                auVar28 = vandps_avx(auVar24,local_278);
              }
              uVar13 = vmovmskps_avx(auVar28);
              uVar15 = CONCAT44((int)((ulong)pRVar14 >> 0x20),uVar13);
              lVar16 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                }
              }
            } while( true );
          }
          local_188 = auVar28;
          local_88 = vpshufd_avx(ZEXT416(uVar11),0);
          uVar11 = (sphere->primIDs).field_0.i[lVar16];
          auVar25._4_4_ = uVar11;
          auVar25._0_4_ = uVar11;
          auVar25._8_4_ = uVar11;
          auVar25._12_4_ = uVar11;
          local_e8._0_4_ = *(undefined4 *)(local_1c8 + lVar16 * 4);
          uVar13 = *(undefined4 *)(local_1b8 + lVar16 * 4);
          auVar40._4_4_ = uVar13;
          auVar40._0_4_ = uVar13;
          auVar40._8_4_ = uVar13;
          auVar40._12_4_ = uVar13;
          local_c8._4_4_ = *(undefined4 *)(local_1a8 + lVar16 * 4);
          local_e8._4_4_ = local_e8._0_4_;
          local_e8._8_4_ = local_e8._0_4_;
          local_e8._12_4_ = local_e8._0_4_;
          local_d8 = auVar40;
          local_c8._0_4_ = local_c8._4_4_;
          local_c8._8_4_ = local_c8._4_4_;
          local_c8._12_4_ = local_c8._4_4_;
          local_b8 = ZEXT432(0) << 0x20;
          local_98 = auVar25;
          uStack_74 = context->user->instID[0];
          local_78 = uStack_74;
          uStack_70 = uStack_74;
          uStack_6c = uStack_74;
          uStack_68 = context->user->instPrimID[0];
          uStack_64 = uStack_68;
          uStack_60 = uStack_68;
          uStack_5c = uStack_68;
          local_23c = *(undefined4 *)(ray + k * 4 + 0x80);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1d8 + lVar16 * 4);
          local_258 = *(undefined8 *)(mm_lookupmask_ps + lVar18);
          uStack_250 = *(undefined8 *)(mm_lookupmask_ps + lVar18 + 8);
          local_230 = pGVar4->userPtr;
          local_228 = context->user;
          local_210 = 4;
          pRVar14 = (RayHitK<4> *)pGVar4->intersectionFilterN;
          local_208 = auVar49._0_16_;
          local_1f8 = auVar52._0_16_;
          local_190 = pSVar17;
          local_108 = auVar46;
          local_118 = auVar35;
          local_128 = auVar23;
          local_138 = auVar37;
          local_148 = auVar24;
          local_158 = auVar50;
          local_168 = auVar22;
          local_178 = auVar29;
          local_260 = context;
          if (pRVar14 != (RayHitK<4> *)0x0) {
            pRVar14 = (RayHitK<4> *)(*(code *)pRVar14)(&local_238);
            auVar54._8_56_ = extraout_var;
            auVar54._0_8_ = extraout_XMM1_Qa;
            auVar25 = auVar54._0_16_;
            auVar62 = ZEXT1664(local_178);
            auVar61 = ZEXT1664(local_168);
            auVar56 = ZEXT1664(local_158);
            auVar54 = ZEXT1664(local_148);
            auVar60 = ZEXT1664(local_138);
            auVar59 = ZEXT1664(local_128);
            auVar58 = ZEXT1664(local_118);
            auVar57 = ZEXT1664(local_108);
            auVar52 = ZEXT1664(local_1f8);
            auVar47 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar49 = ZEXT1664(local_208);
          }
          auVar7._8_8_ = uStack_250;
          auVar7._0_8_ = local_258;
          if (auVar7 == (undefined1  [16])0x0) {
            auVar28 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
            auVar24 = vpcmpeqd_avx(auVar25,auVar25);
            auVar28 = auVar28 ^ auVar24;
            auVar44 = ZEXT1664(local_188);
            context = local_260;
          }
          else {
            pRVar14 = (RayHitK<4> *)local_260->args->filter;
            if ((pRVar14 != (RayHitK<4> *)0x0) &&
               (((local_260->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
              pRVar14 = (RayHitK<4> *)(*(code *)pRVar14)();
              auVar62 = ZEXT1664(local_178);
              auVar61 = ZEXT1664(local_168);
              auVar56 = ZEXT1664(local_158);
              auVar54 = ZEXT1664(local_148);
              auVar60 = ZEXT1664(local_138);
              auVar59 = ZEXT1664(local_128);
              auVar58 = ZEXT1664(local_118);
              auVar57 = ZEXT1664(local_108);
              auVar52 = ZEXT1664(local_1f8);
              auVar47 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar49 = ZEXT1664(local_208);
            }
            auVar8._8_8_ = uStack_250;
            auVar8._0_8_ = local_258;
            auVar24 = vpcmpeqd_avx(auVar8,_DAT_01feba10);
            auVar50 = vpcmpeqd_avx(auVar40,auVar40);
            auVar28 = auVar24 ^ auVar50;
            auVar44 = ZEXT1664(local_188);
            context = local_260;
            if (auVar8 != (undefined1  [16])0x0) {
              auVar24 = auVar24 ^ auVar50;
              auVar50 = vmaskmovps_avx(auVar24,*local_218);
              *(undefined1 (*) [16])(local_220 + 0xc0) = auVar50;
              auVar50 = vmaskmovps_avx(auVar24,local_218[1]);
              *(undefined1 (*) [16])(local_220 + 0xd0) = auVar50;
              auVar50 = vmaskmovps_avx(auVar24,local_218[2]);
              *(undefined1 (*) [16])(local_220 + 0xe0) = auVar50;
              auVar50 = vmaskmovps_avx(auVar24,local_218[3]);
              *(undefined1 (*) [16])(local_220 + 0xf0) = auVar50;
              auVar50 = vmaskmovps_avx(auVar24,local_218[4]);
              *(undefined1 (*) [16])(local_220 + 0x100) = auVar50;
              auVar50 = vmaskmovps_avx(auVar24,local_218[5]);
              *(undefined1 (*) [16])(local_220 + 0x110) = auVar50;
              auVar50 = vmaskmovps_avx(auVar24,local_218[6]);
              *(undefined1 (*) [16])(local_220 + 0x120) = auVar50;
              auVar50 = vmaskmovps_avx(auVar24,local_218[7]);
              *(undefined1 (*) [16])(local_220 + 0x130) = auVar50;
              auVar24 = vmaskmovps_avx(auVar24,local_218[8]);
              *(undefined1 (*) [16])(local_220 + 0x140) = auVar24;
              pRVar14 = local_220;
            }
          }
          pSVar17 = local_190;
          if ((auVar52._0_16_ & auVar28) == (undefined1  [16])0x0) {
            *(undefined4 *)(ray + k * 4 + 0x80) = local_23c;
          }
          *(undefined4 *)(local_278 + lVar16 * 4) = 0;
          uVar13 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar19._4_4_ = uVar13;
          auVar19._0_4_ = uVar13;
          auVar19._8_4_ = uVar13;
          auVar19._12_4_ = uVar13;
          auVar28 = vcmpps_avx(local_1e8,auVar19,2);
          local_278 = vandps_avx(auVar28,local_278);
        }
        uVar13 = (undefined4)((ulong)pRVar14 >> 0x20);
        auVar28 = auVar44._0_16_;
        auVar24 = auVar54._0_16_;
        auVar46 = auVar57._0_16_;
        auVar50 = auVar56._0_16_;
        auVar37 = auVar60._0_16_;
        auVar23 = auVar59._0_16_;
        auVar35 = auVar58._0_16_;
        auVar22 = auVar61._0_16_;
        auVar29 = auVar62._0_16_;
        if ((((local_278 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (local_278 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (local_278 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < local_278[0xf]) goto LAB_00ea06ef;
        auVar28 = vblendvps_avx(auVar47._0_16_,local_1e8,local_278);
        auVar24 = vshufps_avx(auVar28,auVar28,0xb1);
        auVar24 = vminps_avx(auVar24,auVar28);
        auVar50 = vshufpd_avx(auVar24,auVar24,1);
        auVar24 = vminps_avx(auVar50,auVar24);
        auVar24 = vcmpps_avx(auVar28,auVar24,0);
        auVar50 = local_278 & auVar24;
        auVar28 = local_278;
        if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar50[0xf] < '\0') {
          auVar28 = vandps_avx(auVar24,local_278);
        }
        uVar12 = vmovmskps_avx(auVar28);
        lVar16 = 0;
        if (CONCAT44(uVar13,uVar12) != 0) {
          for (; (CONCAT44(uVar13,uVar12) >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }